

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O0

int __thiscall QTcpServer::listen(QTcpServer *this,int __fd,int __n)

{
  quint16 qVar1;
  NetworkLayerProtocol NVar2;
  SocketError SVar3;
  NetworkLayerProtocol NVar4;
  QTcpServerPrivate *this_00;
  QAbstractSocketEngine *pQVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  NetworkLayerProtocol proto;
  QTcpServerPrivate *d;
  QNetworkProxy proxy;
  QHostAddress addr;
  undefined4 in_stack_fffffffffffffef8;
  SpecialAddress in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  QAbstractSocketEngine *in_stack_ffffffffffffff08;
  QMessageLogger *in_stack_ffffffffffffff10;
  QObject *parent;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 local_a1;
  undefined8 local_30;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTcpServer *)0x26263d);
  if (this_00->state == ListeningState) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
               ,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QMessageLogger::warning(local_28,"QTcpServer::listen() called when already listening");
    local_a1 = 0;
  }
  else {
    NVar2 = QHostAddress::protocol((QHostAddress *)0x262690);
    local_30 = 0xaaaaaaaaaaaaaaaa;
    QHostAddress::QHostAddress
              ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (QHostAddress *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QTcpServerPrivate::resolveProxy
              (this_00,(QHostAddress *)CONCAT44(NVar2,in_stack_ffffffffffffff30),
               (quint16)((ulong)this >> 0x30));
    parent = &this_00->socketEngine->super_QObject;
    if (parent != (QObject *)0x0) {
      (**(code **)(*(long *)parent + 0x20))();
    }
    pQVar5 = QAbstractSocketEngine::createSocketEngine(NVar2,(QNetworkProxy *)this,parent);
    this_00->socketEngine = pQVar5;
    if (this_00->socketEngine == (QAbstractSocketEngine *)0x0) {
      this_00->serverSocketError = UnsupportedSocketOperationError;
      tr((char *)in_stack_ffffffffffffff08,
         (char *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
         in_stack_fffffffffffffefc);
      QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                         (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      QString::~QString((QString *)0x262792);
      local_a1 = 0;
    }
    else {
      uVar6 = (**(code **)(*(long *)this_00->socketEngine + 0x60))
                        (this_00->socketEngine,this_00->socketType,NVar2);
      if ((uVar6 & 1) == 0) {
        SVar3 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x2627da);
        this_00->serverSocketError = SVar3;
        QAbstractSocketEngine::errorString(in_stack_ffffffffffffff08);
        QString::operator=((QString *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
        ;
        QString::~QString((QString *)0x262826);
        local_a1 = 0;
      }
      else {
        NVar4 = QAbstractSocketEngine::protocol((QAbstractSocketEngine *)0x262849);
        NVar2 = QHostAddress::protocol((QHostAddress *)0x26285a);
        if ((NVar2 == AnyIPProtocol) && (NVar4 == IPv4Protocol)) {
          QHostAddress::operator=
                    ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
        }
        (**(code **)(*(long *)this_00 + 0x20))();
        uVar6 = (**(code **)(*(long *)this_00->socketEngine + 0x90))
                          (this_00->socketEngine,&local_30,(short)__n);
        if ((uVar6 & 1) == 0) {
          SVar3 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x2628bd);
          this_00->serverSocketError = SVar3;
          QAbstractSocketEngine::errorString(in_stack_ffffffffffffff08);
          QString::operator=((QString *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                             (QString *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          QString::~QString((QString *)0x262909);
          local_a1 = 0;
        }
        else {
          uVar6 = (**(code **)(*(long *)this_00->socketEngine + 0x98))
                            (this_00->socketEngine,this_00->listenBacklog);
          if ((uVar6 & 1) == 0) {
            SVar3 = QAbstractSocketEngine::error((QAbstractSocketEngine *)0x262950);
            this_00->serverSocketError = SVar3;
            QAbstractSocketEngine::errorString(in_stack_ffffffffffffff08);
            QString::operator=((QString *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            QString::~QString((QString *)0x262993);
            local_a1 = 0;
          }
          else {
            pQVar5 = this_00->socketEngine;
            QAbstractSocketEngine::setReceiver
                      ((QAbstractSocketEngine *)
                       CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                       (QAbstractSocketEngineReceiver *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            (**(code **)(*(long *)this_00->socketEngine + 0x140))(this_00->socketEngine,1);
            this_00->state = ListeningState;
            QAbstractSocketEngine::localAddress(pQVar5);
            QHostAddress::operator=
                      ((QHostAddress *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                       ,(QHostAddress *)
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            QHostAddress::~QHostAddress((QHostAddress *)0x262a49);
            qVar1 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)0x262a5a);
            this_00->port = qVar1;
            local_a1 = 1;
          }
        }
      }
    }
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x262a83);
    QHostAddress::~QHostAddress((QHostAddress *)0x262a90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_a1);
  }
  __stack_chk_fail();
}

Assistant:

bool QTcpServer::listen(const QHostAddress &address, quint16 port)
{
    Q_D(QTcpServer);
    if (d->state == QAbstractSocket::ListeningState) {
        qWarning("QTcpServer::listen() called when already listening");
        return false;
    }

    QAbstractSocket::NetworkLayerProtocol proto = address.protocol();
    QHostAddress addr = address;

#ifdef QT_NO_NETWORKPROXY
    static const QNetworkProxy &proxy = *(QNetworkProxy *)0;
#else
    QNetworkProxy proxy = d->resolveProxy(addr, port);
#endif

    delete d->socketEngine;
    d->socketEngine = QAbstractSocketEngine::createSocketEngine(d->socketType, proxy, this);
    if (!d->socketEngine) {
        d->serverSocketError = QAbstractSocket::UnsupportedSocketOperationError;
        d->serverSocketErrorString = tr("Operation on socket is not supported");
        return false;
    }
    if (!d->socketEngine->initialize(d->socketType, proto)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }
    proto = d->socketEngine->protocol();
    if (addr.protocol() == QAbstractSocket::AnyIPProtocol && proto == QAbstractSocket::IPv4Protocol)
        addr = QHostAddress::AnyIPv4;

    d->configureCreatedSocket();

    if (!d->socketEngine->bind(addr, port)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }

    if (!d->socketEngine->listen(d->listenBacklog)) {
        d->serverSocketError = d->socketEngine->error();
        d->serverSocketErrorString = d->socketEngine->errorString();
        return false;
    }

    d->socketEngine->setReceiver(d);
    d->socketEngine->setReadNotificationEnabled(true);

    d->state = QAbstractSocket::ListeningState;
    d->address = d->socketEngine->localAddress();
    d->port = d->socketEngine->localPort();

#if defined (QTCPSERVER_DEBUG)
    qDebug("QTcpServer::listen(%i, \"%s\") == true (listening on port %i)", port,
           address.toString().toLatin1().constData(), d->socketEngine->localPort());
#endif
    return true;
}